

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O3

bool __thiscall
ddd::DictionarySGL<true,_false>::insert_key
          (DictionarySGL<true,_false> *this,char *key,uint32_t value)

{
  bool bVar1;
  Query local_20;
  
  local_20.pos_ = 0;
  local_20.node_pos_ = 0;
  local_20.is_finished_ = false;
  local_20.key_ = key;
  local_20.value_ = value;
  bVar1 = DaTrie<true,_false,_false>::insert_key
                    ((this->trie_)._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<true,_false,_false>_*,_false>._M_head_impl,
                     &local_20);
  if (bVar1) {
    this->num_keys_ = this->num_keys_ + 1;
  }
  return bVar1;
}

Assistant:

bool insert_key(const char* key, uint32_t value) {
    assert((value >> 31) == 0);

    Query query(key);
    query.set_value(value);
    if (!trie_->insert_key(query)) {
      return false;
    }
    ++num_keys_;
    return true;
  }